

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void place_random_door(chunk_conflict *c,loc_conflict grid)

{
  uint32_t uVar1;
  wchar_t *pwVar2;
  
  uVar1 = Rand_div(100);
  if ((int)uVar1 < 0x1e) {
    pwVar2 = &FEAT_OPEN;
  }
  else {
    if (0x27 < (int)uVar1) {
      place_closed_door(c,grid);
      return;
    }
    pwVar2 = &FEAT_BROKEN;
  }
  square_set_feat(c,(loc)grid,*pwVar2);
  return;
}

Assistant:

void place_random_door(struct chunk *c, struct loc grid)
{
	int tmp = randint0(100);

	if (tmp < 30)
		square_set_feat(c, grid, FEAT_OPEN);
	else if (tmp < 40)
		square_set_feat(c, grid, FEAT_BROKEN);
	else
		place_closed_door(c, grid);
}